

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O2

int oonf_cfg_load_subsystems(void)

{
  avl_node *paVar1;
  list_entity *plVar2;
  int iVar3;
  oonf_subsystem *poVar4;
  size_t sVar5;
  avl_node *paVar6;
  avl_node *paVar7;
  list_entity *plVar8;
  char *pcVar9;
  oonf_subsystem_namebuf nbuf;
  
  for (pcVar9 = config_global.plugin.value;
      (pcVar9 != (char *)0x0 && (pcVar9 < config_global.plugin.value + config_global.plugin.length))
      ; pcVar9 = pcVar9 + sVar5 + 1) {
    if (*pcVar9 != '\0') {
      oonf_subsystem_extract_name(&nbuf,pcVar9);
      poVar4 = oonf_cfg_load_subsystem(nbuf.name);
      if ((poVar4 == (oonf_subsystem *)0x0) && (config_global.failfast != false)) {
        return -1;
      }
    }
    sVar5 = strlen(pcVar9);
  }
  paVar1 = (avl_node *)oonf_plugin_tree.list_head.next;
LAB_0012cbae:
  do {
    do {
      paVar7 = paVar1;
      plVar8 = oonf_plugin_tree.list_head.next;
      if ((paVar7->list).prev == oonf_plugin_tree.list_head.prev) {
        do {
          if (plVar8->prev == oonf_plugin_tree.list_head.prev) {
            return 0;
          }
          plVar2 = plVar8->next;
          iVar3 = oonf_subsystem_call_init((oonf_subsystem *)(plVar8 + -7));
          plVar8 = plVar2;
        } while (iVar3 == 0);
        return -1;
      }
      paVar1 = (avl_node *)(paVar7->list).next;
    } while (paVar7[-1].key == (void *)0x0);
    for (pcVar9 = config_global.plugin.value;
        (pcVar9 != (char *)0x0 &&
        (pcVar9 < config_global.plugin.value + config_global.plugin.length));
        pcVar9 = pcVar9 + sVar5 + 1) {
      oonf_subsystem_extract_name(&nbuf,pcVar9);
      paVar6 = avl_find(&oonf_plugin_tree,&nbuf);
      if (paVar6 == paVar7) goto LAB_0012cbae;
      sVar5 = strlen(pcVar9);
    }
    oonf_subsystem_unload((oonf_subsystem *)(paVar7 + -2));
  } while( true );
}

Assistant:

int
oonf_cfg_load_subsystems(void) {
  struct oonf_subsystem *plugin, *plugin_it;
  struct oonf_subsystem_namebuf nbuf;
  char *ptr;
  bool found;

  /* load plugins */
  strarray_for_each_element(&config_global.plugin, ptr) {
    /* ignore empty strings */
    if (*ptr == 0) {
      continue;
    }

    oonf_subsystem_extract_name(&nbuf, ptr);

    if (oonf_cfg_load_subsystem(nbuf.name) == NULL && config_global.failfast) {
      return -1;
    }
  }

  /* unload all plugins that are not in use anymore */
  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, plugin_it) {
    if (plugin->_dlhandle == NULL) {
      /* ignore static plugins */
      continue;
    }

    found = false;

    /* search if plugin should still be active */
    strarray_for_each_element(&config_global.plugin, ptr) {
      oonf_subsystem_extract_name(&nbuf, ptr);

      if (oonf_subsystem_get(nbuf.name) == plugin) {
        found = true;
        break;
      }
    }

    if (!found) {
      /* if not, unload it (if not static) */
      oonf_subsystem_unload(plugin);
    }
  }

  /* initialize all plugins */
  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, plugin_it) {
    if (oonf_subsystem_call_init(plugin)) {
      return -1;
    }
  }
  return 0;
}